

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  float fVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long lVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar113;
  float fVar115;
  float fVar116;
  undefined1 auVar114 [16];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  UVIdentity<4> mapUV;
  NodeRef *local_b48;
  NodeRef *local_b40;
  undefined1 local_a78 [16];
  undefined1 (*local_a60) [16];
  ulong local_a58;
  long local_a50;
  long local_a48;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  UVIdentity<4> *local_8e8;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  undefined1 auVar104 [64];
  
  local_b40 = stack + 1;
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar80._4_4_ = uVar2;
  auVar80._0_4_ = uVar2;
  auVar80._8_4_ = uVar2;
  auVar80._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar86._4_4_ = uVar2;
  auVar86._0_4_ = uVar2;
  auVar86._8_4_ = uVar2;
  auVar86._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar94._4_4_ = uVar2;
  auVar94._0_4_ = uVar2;
  auVar94._8_4_ = uVar2;
  auVar94._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar18 = fVar3 * 0.99999964;
  fVar19 = fVar4 * 0.99999964;
  fVar20 = fVar5 * 0.99999964;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = uVar34 ^ 0x10;
  iVar6 = (tray->tnear).field_0.i[k];
  auVar114._4_4_ = iVar6;
  auVar114._0_4_ = iVar6;
  auVar114._8_4_ = iVar6;
  auVar114._12_4_ = iVar6;
  iVar6 = (tray->tfar).field_0.i[k];
  auVar118._4_4_ = iVar6;
  auVar118._0_4_ = iVar6;
  auVar118._8_4_ = iVar6;
  auVar118._12_4_ = iVar6;
  local_a60 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_a58 = uVar34;
  do {
    if (local_b40 == stack) {
LAB_0157c2e5:
      return local_b40 != stack;
    }
    local_b48 = local_b40 + -1;
    sVar40 = local_b40[-1].ptr;
    while ((sVar40 & 8) == 0) {
      uVar23 = sVar40 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar42._4_4_ = uVar2;
      auVar42._0_4_ = uVar2;
      auVar42._8_4_ = uVar2;
      auVar42._12_4_ = uVar2;
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar34),auVar42,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + uVar34));
      auVar43 = vsubps_avx(auVar43,auVar80);
      auVar49._0_4_ = fVar18 * auVar43._0_4_;
      auVar49._4_4_ = fVar18 * auVar43._4_4_;
      auVar49._8_4_ = fVar18 * auVar43._8_4_;
      auVar49._12_4_ = fVar18 * auVar43._12_4_;
      auVar43 = vmaxps_avx(auVar114,auVar49);
      auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar28),auVar42,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + uVar28));
      auVar49 = vsubps_avx(auVar49,auVar86);
      auVar56._0_4_ = fVar19 * auVar49._0_4_;
      auVar56._4_4_ = fVar19 * auVar49._4_4_;
      auVar56._8_4_ = fVar19 * auVar49._8_4_;
      auVar56._12_4_ = fVar19 * auVar49._12_4_;
      auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar41),auVar42,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + uVar41));
      auVar49 = vsubps_avx(auVar49,auVar94);
      auVar66._0_4_ = fVar20 * auVar49._0_4_;
      auVar66._4_4_ = fVar20 * auVar49._4_4_;
      auVar66._8_4_ = fVar20 * auVar49._8_4_;
      auVar66._12_4_ = fVar20 * auVar49._12_4_;
      auVar49 = vmaxps_avx(auVar56,auVar66);
      auVar43 = vmaxps_avx(auVar43,auVar49);
      auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar29),auVar42,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + uVar29));
      auVar49 = vsubps_avx(auVar49,auVar80);
      auVar57._0_4_ = fVar3 * auVar49._0_4_;
      auVar57._4_4_ = fVar3 * auVar49._4_4_;
      auVar57._8_4_ = fVar3 * auVar49._8_4_;
      auVar57._12_4_ = fVar3 * auVar49._12_4_;
      auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar28 ^ 0x10)),auVar42,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar28 ^ 0x10)));
      auVar49 = vminps_avx(auVar118,auVar57);
      auVar56 = vsubps_avx(auVar56,auVar86);
      auVar67._0_4_ = fVar4 * auVar56._0_4_;
      auVar67._4_4_ = fVar4 * auVar56._4_4_;
      auVar67._8_4_ = fVar4 * auVar56._8_4_;
      auVar67._12_4_ = fVar4 * auVar56._12_4_;
      auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar41 ^ 0x10)),auVar42,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar41 ^ 0x10)));
      auVar56 = vsubps_avx(auVar56,auVar94);
      auVar73._0_4_ = fVar5 * auVar56._0_4_;
      auVar73._4_4_ = fVar5 * auVar56._4_4_;
      auVar73._8_4_ = fVar5 * auVar56._8_4_;
      auVar73._12_4_ = fVar5 * auVar56._12_4_;
      auVar56 = vminps_avx(auVar67,auVar73);
      auVar49 = vminps_avx(auVar49,auVar56);
      if (((uint)sVar40 & 7) == 6) {
        auVar49 = vcmpps_avx(auVar43,auVar49,2);
        auVar43 = vcmpps_avx(*(undefined1 (*) [16])(uVar23 + 0xe0),auVar42,2);
        auVar56 = vcmpps_avx(auVar42,*(undefined1 (*) [16])(uVar23 + 0xf0),1);
        auVar43 = vandps_avx(auVar43,auVar56);
        auVar43 = vandps_avx(auVar43,auVar49);
      }
      else {
        auVar43 = vcmpps_avx(auVar43,auVar49,2);
      }
      auVar43 = vpslld_avx(auVar43,0x1f);
      uVar24 = vmovmskps_avx(auVar43);
      if (uVar24 == 0) goto LAB_0157c2ba;
      uVar24 = uVar24 & 0xff;
      lVar22 = 0;
      for (uVar25 = (ulong)uVar24; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      sVar40 = *(size_t *)(uVar23 + lVar22 * 8);
      uVar24 = uVar24 - 1 & uVar24;
      uVar25 = (ulong)uVar24;
      if (uVar24 != 0) {
        do {
          local_b48->ptr = sVar40;
          local_b48 = local_b48 + 1;
          lVar22 = 0;
          for (uVar27 = uVar25; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar25 = uVar25 - 1 & uVar25;
          sVar40 = *(size_t *)(uVar23 + lVar22 * 8);
        } while (uVar25 != 0);
      }
    }
    local_a48 = (ulong)((uint)sVar40 & 0xf) - 8;
    uVar23 = sVar40 & 0xfffffffffffffff0;
    for (local_a50 = 0; local_a50 != local_a48; local_a50 = local_a50 + 1) {
      lVar31 = local_a50 * 0x50;
      scene = context->scene;
      pGVar9 = (scene->geometries).items[*(uint *)(uVar23 + 0x30 + lVar31)].ptr;
      fVar7 = (pGVar9->time_range).lower;
      fVar7 = pGVar9->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar7) / ((pGVar9->time_range).upper - fVar7));
      auVar43 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
      auVar43 = vminss_avx(auVar43,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar75 = vmaxss_avx(ZEXT816(0),auVar43);
      lVar26 = (long)(int)auVar75._0_4_ * 0x38;
      uVar32 = (ulong)*(uint *)(uVar23 + 4 + lVar31);
      lVar22 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar26);
      lVar26 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar26);
      auVar43 = *(undefined1 (*) [16])(lVar22 + (ulong)*(uint *)(uVar23 + lVar31) * 4);
      uVar27 = (ulong)*(uint *)(uVar23 + 0x10 + lVar31);
      auVar49 = *(undefined1 (*) [16])(lVar22 + uVar27 * 4);
      uVar35 = (ulong)*(uint *)(uVar23 + 0x20 + lVar31);
      auVar46 = *(undefined1 (*) [16])(lVar22 + uVar35 * 4);
      auVar56 = *(undefined1 (*) [16])(lVar22 + uVar32 * 4);
      uVar36 = (ulong)*(uint *)(uVar23 + 0x14 + lVar31);
      auVar42 = *(undefined1 (*) [16])(lVar22 + uVar36 * 4);
      uVar37 = (ulong)*(uint *)(uVar23 + 0x24 + lVar31);
      auVar51 = *(undefined1 (*) [16])(lVar22 + uVar37 * 4);
      uVar30 = (ulong)*(uint *)(uVar23 + 8 + lVar31);
      auVar57 = *(undefined1 (*) [16])(lVar22 + uVar30 * 4);
      uVar34 = (ulong)*(uint *)(uVar23 + 0x18 + lVar31);
      auVar66 = *(undefined1 (*) [16])(lVar22 + uVar34 * 4);
      uVar38 = (ulong)*(uint *)(uVar23 + 0x28 + lVar31);
      auVar67 = *(undefined1 (*) [16])(lVar22 + uVar38 * 4);
      uVar33 = (ulong)*(uint *)(uVar23 + 0xc + lVar31);
      auVar73 = *(undefined1 (*) [16])(lVar22 + uVar33 * 4);
      uVar39 = (ulong)*(uint *)(uVar23 + 0x1c + lVar31);
      auVar53 = *(undefined1 (*) [16])(lVar22 + uVar39 * 4);
      uVar25 = (ulong)*(uint *)(uVar23 + 0x2c + lVar31);
      auVar71 = *(undefined1 (*) [16])(lVar22 + uVar25 * 4);
      auVar72 = *(undefined1 (*) [16])(lVar26 + (ulong)*(uint *)(uVar23 + lVar31) * 4);
      auVar99 = *(undefined1 (*) [16])(lVar26 + uVar27 * 4);
      fVar7 = fVar7 - auVar75._0_4_;
      auVar75 = vunpcklps_avx(auVar43,auVar57);
      auVar57 = vunpckhps_avx(auVar43,auVar57);
      auVar50 = vunpcklps_avx(auVar56,auVar73);
      auVar56 = vunpckhps_avx(auVar56,auVar73);
      auVar43 = *(undefined1 (*) [16])(lVar26 + uVar32 * 4);
      auVar44 = vunpcklps_avx(auVar57,auVar56);
      auVar45 = vunpcklps_avx(auVar75,auVar50);
      auVar57 = vunpckhps_avx(auVar75,auVar50);
      auVar73 = vunpcklps_avx(auVar49,auVar66);
      auVar56 = vunpckhps_avx(auVar49,auVar66);
      auVar66 = vunpcklps_avx(auVar42,auVar53);
      auVar42 = vunpckhps_avx(auVar42,auVar53);
      auVar49 = *(undefined1 (*) [16])(lVar26 + uVar30 * 4);
      auVar53 = vunpcklps_avx(auVar56,auVar42);
      auVar75 = vunpcklps_avx(auVar73,auVar66);
      auVar42 = vunpckhps_avx(auVar73,auVar66);
      auVar73 = vunpcklps_avx(auVar46,auVar67);
      auVar66 = vunpckhps_avx(auVar46,auVar67);
      auVar50 = vunpcklps_avx(auVar51,auVar71);
      auVar67 = vunpckhps_avx(auVar51,auVar71);
      auVar56 = *(undefined1 (*) [16])(lVar26 + uVar33 * 4);
      auVar71 = vunpcklps_avx(auVar66,auVar67);
      auVar46 = vunpcklps_avx(auVar73,auVar50);
      auVar66 = vunpckhps_avx(auVar73,auVar50);
      auVar67 = vunpcklps_avx(auVar72,auVar49);
      auVar49 = vunpckhps_avx(auVar72,auVar49);
      auVar73 = vunpcklps_avx(auVar43,auVar56);
      auVar56 = vunpckhps_avx(auVar43,auVar56);
      auVar43 = *(undefined1 (*) [16])(lVar26 + uVar34 * 4);
      auVar72 = vunpcklps_avx(auVar49,auVar56);
      auVar50 = vunpcklps_avx(auVar67,auVar73);
      auVar56 = vunpckhps_avx(auVar67,auVar73);
      auVar73 = vunpcklps_avx(auVar99,auVar43);
      auVar67 = vunpckhps_avx(auVar99,auVar43);
      auVar43 = *(undefined1 (*) [16])(lVar26 + uVar36 * 4);
      auVar49 = *(undefined1 (*) [16])(lVar26 + uVar39 * 4);
      auVar99 = vunpcklps_avx(auVar43,auVar49);
      auVar43 = vunpckhps_avx(auVar43,auVar49);
      auVar51 = vunpcklps_avx(auVar67,auVar43);
      auVar52 = vunpcklps_avx(auVar73,auVar99);
      auVar67 = vunpckhps_avx(auVar73,auVar99);
      auVar43 = *(undefined1 (*) [16])(lVar26 + uVar35 * 4);
      auVar49 = *(undefined1 (*) [16])(lVar26 + uVar38 * 4);
      auVar99 = vunpcklps_avx(auVar43,auVar49);
      auVar73 = vunpckhps_avx(auVar43,auVar49);
      auVar43 = *(undefined1 (*) [16])(lVar26 + uVar37 * 4);
      auVar49 = *(undefined1 (*) [16])(lVar26 + uVar25 * 4);
      auVar58 = vunpcklps_avx(auVar43,auVar49);
      auVar43 = vunpckhps_avx(auVar43,auVar49);
      auVar49 = vunpcklps_avx(auVar73,auVar43);
      auVar73 = vunpcklps_avx(auVar99,auVar58);
      auVar43 = vunpckhps_avx(auVar99,auVar58);
      fVar21 = 1.0 - fVar7;
      auVar106._4_4_ = fVar21;
      auVar106._0_4_ = fVar21;
      auVar106._8_4_ = fVar21;
      auVar106._12_4_ = fVar21;
      auVar99._0_4_ = fVar7 * auVar50._0_4_;
      auVar99._4_4_ = fVar7 * auVar50._4_4_;
      auVar99._8_4_ = fVar7 * auVar50._8_4_;
      auVar99._12_4_ = fVar7 * auVar50._12_4_;
      auVar99 = vfmadd231ps_fma(auVar99,auVar106,auVar45);
      auVar87._0_4_ = fVar7 * auVar56._0_4_;
      auVar87._4_4_ = fVar7 * auVar56._4_4_;
      auVar87._8_4_ = fVar7 * auVar56._8_4_;
      auVar87._12_4_ = fVar7 * auVar56._12_4_;
      auVar56 = vfmadd231ps_fma(auVar87,auVar106,auVar57);
      auVar95._0_4_ = fVar7 * auVar72._0_4_;
      auVar95._4_4_ = fVar7 * auVar72._4_4_;
      auVar95._8_4_ = fVar7 * auVar72._8_4_;
      auVar95._12_4_ = fVar7 * auVar72._12_4_;
      auVar72 = vfmadd231ps_fma(auVar95,auVar106,auVar44);
      auVar100._0_4_ = fVar7 * auVar52._0_4_;
      auVar100._4_4_ = fVar7 * auVar52._4_4_;
      auVar100._8_4_ = fVar7 * auVar52._8_4_;
      auVar100._12_4_ = fVar7 * auVar52._12_4_;
      auVar75 = vfmadd231ps_fma(auVar100,auVar106,auVar75);
      auVar74._0_4_ = fVar7 * auVar67._0_4_;
      auVar74._4_4_ = fVar7 * auVar67._4_4_;
      auVar74._8_4_ = fVar7 * auVar67._8_4_;
      auVar74._12_4_ = fVar7 * auVar67._12_4_;
      auVar67 = vfmadd231ps_fma(auVar74,auVar106,auVar42);
      puVar1 = (undefined8 *)(uVar23 + 0x30 + lVar31);
      local_928 = *puVar1;
      uStack_920 = puVar1[1];
      puVar1 = (undefined8 *)(uVar23 + 0x40 + lVar31);
      auVar50._0_4_ = fVar7 * auVar51._0_4_;
      auVar50._4_4_ = fVar7 * auVar51._4_4_;
      auVar50._8_4_ = fVar7 * auVar51._8_4_;
      auVar50._12_4_ = fVar7 * auVar51._12_4_;
      auVar53 = vfmadd231ps_fma(auVar50,auVar106,auVar53);
      auVar58._0_4_ = fVar7 * auVar73._0_4_;
      auVar58._4_4_ = fVar7 * auVar73._4_4_;
      auVar58._8_4_ = fVar7 * auVar73._8_4_;
      auVar58._12_4_ = fVar7 * auVar73._12_4_;
      auVar68._0_4_ = fVar7 * auVar43._0_4_;
      auVar68._4_4_ = fVar7 * auVar43._4_4_;
      auVar68._8_4_ = fVar7 * auVar43._8_4_;
      auVar68._12_4_ = fVar7 * auVar43._12_4_;
      auVar81._0_4_ = fVar7 * auVar49._0_4_;
      auVar81._4_4_ = fVar7 * auVar49._4_4_;
      auVar81._8_4_ = fVar7 * auVar49._8_4_;
      auVar81._12_4_ = fVar7 * auVar49._12_4_;
      auVar73 = vfmadd231ps_fma(auVar58,auVar106,auVar46);
      auVar50 = vfmadd231ps_fma(auVar68,auVar106,auVar66);
      auVar71 = vfmadd231ps_fma(auVar81,auVar106,auVar71);
      local_938 = *puVar1;
      uStack_930 = puVar1[1];
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar44._4_4_ = uVar2;
      auVar44._0_4_ = uVar2;
      auVar44._8_4_ = uVar2;
      auVar44._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar105._4_4_ = uVar2;
      auVar105._0_4_ = uVar2;
      auVar105._8_4_ = uVar2;
      auVar105._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar108._4_4_ = uVar2;
      auVar108._0_4_ = uVar2;
      auVar108._8_4_ = uVar2;
      auVar108._12_4_ = uVar2;
      auVar42 = vsubps_avx(auVar99,auVar44);
      auVar57 = vsubps_avx(auVar56,auVar105);
      auVar43 = vsubps_avx(auVar72,auVar108);
      auVar49 = vsubps_avx(auVar75,auVar44);
      auVar56 = vsubps_avx(auVar67,auVar105);
      auVar66 = vsubps_avx(auVar53,auVar108);
      auVar67 = vsubps_avx(auVar73,auVar44);
      auVar73 = vsubps_avx(auVar50,auVar105);
      auVar53 = vsubps_avx(auVar71,auVar108);
      auVar71 = vsubps_avx(auVar67,auVar42);
      auVar72 = vsubps_avx(auVar73,auVar57);
      auVar99 = vsubps_avx(auVar53,auVar43);
      auVar45._0_4_ = auVar42._0_4_ + auVar67._0_4_;
      auVar45._4_4_ = auVar42._4_4_ + auVar67._4_4_;
      auVar45._8_4_ = auVar42._8_4_ + auVar67._8_4_;
      auVar45._12_4_ = auVar42._12_4_ + auVar67._12_4_;
      auVar69._0_4_ = auVar73._0_4_ + auVar57._0_4_;
      auVar69._4_4_ = auVar73._4_4_ + auVar57._4_4_;
      auVar69._8_4_ = auVar73._8_4_ + auVar57._8_4_;
      auVar69._12_4_ = auVar73._12_4_ + auVar57._12_4_;
      fVar21 = auVar43._0_4_;
      auVar75._0_4_ = auVar53._0_4_ + fVar21;
      fVar11 = auVar43._4_4_;
      auVar75._4_4_ = auVar53._4_4_ + fVar11;
      fVar12 = auVar43._8_4_;
      auVar75._8_4_ = auVar53._8_4_ + fVar12;
      fVar13 = auVar43._12_4_;
      auVar75._12_4_ = auVar53._12_4_ + fVar13;
      auVar109._0_4_ = auVar99._0_4_ * auVar69._0_4_;
      auVar109._4_4_ = auVar99._4_4_ * auVar69._4_4_;
      auVar109._8_4_ = auVar99._8_4_ * auVar69._8_4_;
      auVar109._12_4_ = auVar99._12_4_ * auVar69._12_4_;
      auVar50 = vfmsub231ps_fma(auVar109,auVar72,auVar75);
      auVar76._0_4_ = auVar71._0_4_ * auVar75._0_4_;
      auVar76._4_4_ = auVar71._4_4_ * auVar75._4_4_;
      auVar76._8_4_ = auVar71._8_4_ * auVar75._8_4_;
      auVar76._12_4_ = auVar71._12_4_ * auVar75._12_4_;
      auVar75 = vfmsub231ps_fma(auVar76,auVar99,auVar45);
      auVar46._0_4_ = auVar72._0_4_ * auVar45._0_4_;
      auVar46._4_4_ = auVar72._4_4_ * auVar45._4_4_;
      auVar46._8_4_ = auVar72._8_4_ * auVar45._8_4_;
      auVar46._12_4_ = auVar72._12_4_ * auVar45._12_4_;
      auVar44 = vfmsub231ps_fma(auVar46,auVar71,auVar69);
      fVar7 = *(float *)(ray + k * 4 + 0x60);
      auVar70._0_4_ = fVar7 * auVar44._0_4_;
      auVar70._4_4_ = fVar7 * auVar44._4_4_;
      auVar70._8_4_ = fVar7 * auVar44._8_4_;
      auVar70._12_4_ = fVar7 * auVar44._12_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar119._4_4_ = uVar2;
      auVar119._0_4_ = uVar2;
      auVar119._8_4_ = uVar2;
      auVar119._12_4_ = uVar2;
      auVar75 = vfmadd231ps_fma(auVar70,auVar119,auVar75);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar101._4_4_ = uVar2;
      auVar101._0_4_ = uVar2;
      auVar101._8_4_ = uVar2;
      auVar101._12_4_ = uVar2;
      auVar46 = vfmadd231ps_fma(auVar75,auVar101,auVar50);
      auVar75 = vsubps_avx(auVar57,auVar56);
      auVar50 = vsubps_avx(auVar43,auVar66);
      auVar51._0_4_ = auVar57._0_4_ + auVar56._0_4_;
      auVar51._4_4_ = auVar57._4_4_ + auVar56._4_4_;
      auVar51._8_4_ = auVar57._8_4_ + auVar56._8_4_;
      auVar51._12_4_ = auVar57._12_4_ + auVar56._12_4_;
      auVar43._0_4_ = auVar66._0_4_ + fVar21;
      auVar43._4_4_ = auVar66._4_4_ + fVar11;
      auVar43._8_4_ = auVar66._8_4_ + fVar12;
      auVar43._12_4_ = auVar66._12_4_ + fVar13;
      fVar14 = auVar50._0_4_;
      auVar88._0_4_ = auVar51._0_4_ * fVar14;
      fVar15 = auVar50._4_4_;
      auVar88._4_4_ = auVar51._4_4_ * fVar15;
      fVar16 = auVar50._8_4_;
      auVar88._8_4_ = auVar51._8_4_ * fVar16;
      fVar17 = auVar50._12_4_;
      auVar88._12_4_ = auVar51._12_4_ * fVar17;
      auVar45 = vfmsub231ps_fma(auVar88,auVar75,auVar43);
      auVar44 = vsubps_avx(auVar42,auVar49);
      fVar107 = auVar44._0_4_;
      auVar96._0_4_ = fVar107 * auVar43._0_4_;
      fVar110 = auVar44._4_4_;
      auVar96._4_4_ = fVar110 * auVar43._4_4_;
      fVar111 = auVar44._8_4_;
      auVar96._8_4_ = fVar111 * auVar43._8_4_;
      fVar112 = auVar44._12_4_;
      auVar96._12_4_ = fVar112 * auVar43._12_4_;
      auVar77._0_4_ = auVar42._0_4_ + auVar49._0_4_;
      auVar77._4_4_ = auVar42._4_4_ + auVar49._4_4_;
      auVar77._8_4_ = auVar42._8_4_ + auVar49._8_4_;
      auVar77._12_4_ = auVar42._12_4_ + auVar49._12_4_;
      auVar43 = vfmsub231ps_fma(auVar96,auVar50,auVar77);
      fVar113 = auVar75._0_4_;
      auVar78._0_4_ = fVar113 * auVar77._0_4_;
      fVar115 = auVar75._4_4_;
      auVar78._4_4_ = fVar115 * auVar77._4_4_;
      fVar116 = auVar75._8_4_;
      auVar78._8_4_ = fVar116 * auVar77._8_4_;
      fVar117 = auVar75._12_4_;
      auVar78._12_4_ = fVar117 * auVar77._12_4_;
      auVar51 = vfmsub231ps_fma(auVar78,auVar44,auVar51);
      auVar79._0_4_ = fVar7 * auVar51._0_4_;
      auVar79._4_4_ = fVar7 * auVar51._4_4_;
      auVar79._8_4_ = fVar7 * auVar51._8_4_;
      auVar79._12_4_ = fVar7 * auVar51._12_4_;
      auVar43 = vfmadd231ps_fma(auVar79,auVar119,auVar43);
      local_908 = vfmadd231ps_fma(auVar43,auVar101,auVar45);
      auVar45 = vsubps_avx(auVar49,auVar67);
      auVar59._0_4_ = auVar49._0_4_ + auVar67._0_4_;
      auVar59._4_4_ = auVar49._4_4_ + auVar67._4_4_;
      auVar59._8_4_ = auVar49._8_4_ + auVar67._8_4_;
      auVar59._12_4_ = auVar49._12_4_ + auVar67._12_4_;
      auVar67 = vsubps_avx(auVar56,auVar73);
      auVar52._0_4_ = auVar73._0_4_ + auVar56._0_4_;
      auVar52._4_4_ = auVar73._4_4_ + auVar56._4_4_;
      auVar52._8_4_ = auVar73._8_4_ + auVar56._8_4_;
      auVar52._12_4_ = auVar73._12_4_ + auVar56._12_4_;
      auVar73 = vsubps_avx(auVar66,auVar53);
      auVar82._0_4_ = auVar66._0_4_ + auVar53._0_4_;
      auVar82._4_4_ = auVar66._4_4_ + auVar53._4_4_;
      auVar82._8_4_ = auVar66._8_4_ + auVar53._8_4_;
      auVar82._12_4_ = auVar66._12_4_ + auVar53._12_4_;
      auVar89._0_4_ = auVar73._0_4_ * auVar52._0_4_;
      auVar89._4_4_ = auVar73._4_4_ * auVar52._4_4_;
      auVar89._8_4_ = auVar73._8_4_ * auVar52._8_4_;
      auVar89._12_4_ = auVar73._12_4_ * auVar52._12_4_;
      auVar49 = vfmsub231ps_fma(auVar89,auVar67,auVar82);
      auVar83._0_4_ = auVar82._0_4_ * auVar45._0_4_;
      auVar83._4_4_ = auVar82._4_4_ * auVar45._4_4_;
      auVar83._8_4_ = auVar82._8_4_ * auVar45._8_4_;
      auVar83._12_4_ = auVar82._12_4_ * auVar45._12_4_;
      auVar43 = vfmsub231ps_fma(auVar83,auVar73,auVar59);
      auVar60._0_4_ = auVar67._0_4_ * auVar59._0_4_;
      auVar60._4_4_ = auVar67._4_4_ * auVar59._4_4_;
      auVar60._8_4_ = auVar67._8_4_ * auVar59._8_4_;
      auVar60._12_4_ = auVar67._12_4_ * auVar59._12_4_;
      auVar56 = vfmsub231ps_fma(auVar60,auVar45,auVar52);
      auVar61._0_4_ = fVar7 * auVar56._0_4_;
      auVar61._4_4_ = fVar7 * auVar56._4_4_;
      auVar61._8_4_ = fVar7 * auVar56._8_4_;
      auVar61._12_4_ = fVar7 * auVar56._12_4_;
      auVar43 = vfmadd231ps_fma(auVar61,auVar119,auVar43);
      auVar66 = vfmadd231ps_fma(auVar43,auVar101,auVar49);
      local_918 = auVar46._0_4_;
      fStack_914 = auVar46._4_4_;
      fStack_910 = auVar46._8_4_;
      fStack_90c = auVar46._12_4_;
      local_8f8._0_4_ = auVar66._0_4_ + local_918 + local_908._0_4_;
      local_8f8._4_4_ = auVar66._4_4_ + fStack_914 + local_908._4_4_;
      local_8f8._8_4_ = auVar66._8_4_ + fStack_910 + local_908._8_4_;
      local_8f8._12_4_ = auVar66._12_4_ + fStack_90c + local_908._12_4_;
      auVar53._8_4_ = 0x7fffffff;
      auVar53._0_8_ = 0x7fffffff7fffffff;
      auVar53._12_4_ = 0x7fffffff;
      auVar43 = vminps_avx(auVar46,local_908);
      auVar49 = vminps_avx(auVar43,auVar66);
      auVar43 = vandps_avx(local_8f8,auVar53);
      auVar97._0_4_ = auVar43._0_4_ * 1.1920929e-07;
      auVar97._4_4_ = auVar43._4_4_ * 1.1920929e-07;
      auVar97._8_4_ = auVar43._8_4_ * 1.1920929e-07;
      auVar97._12_4_ = auVar43._12_4_ * 1.1920929e-07;
      uVar34 = CONCAT44(auVar97._4_4_,auVar97._0_4_);
      auVar90._0_8_ = uVar34 ^ 0x8000000080000000;
      auVar90._8_4_ = -auVar97._8_4_;
      auVar90._12_4_ = -auVar97._12_4_;
      auVar49 = vcmpps_avx(auVar49,auVar90,5);
      auVar56 = vmaxps_avx(auVar46,local_908);
      auVar56 = vmaxps_avx(auVar56,auVar66);
      auVar56 = vcmpps_avx(auVar56,auVar97,2);
      auVar49 = vorps_avx(auVar49,auVar56);
      if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar49[0xf] < '\0'
         ) {
        auVar62._0_4_ = fVar113 * auVar99._0_4_;
        auVar62._4_4_ = fVar115 * auVar99._4_4_;
        auVar62._8_4_ = fVar116 * auVar99._8_4_;
        auVar62._12_4_ = fVar117 * auVar99._12_4_;
        auVar84._0_4_ = auVar72._0_4_ * fVar107;
        auVar84._4_4_ = auVar72._4_4_ * fVar110;
        auVar84._8_4_ = auVar72._8_4_ * fVar111;
        auVar84._12_4_ = auVar72._12_4_ * fVar112;
        auVar72 = vfmsub213ps_fma(auVar72,auVar50,auVar62);
        auVar91._0_4_ = auVar67._0_4_ * fVar14;
        auVar91._4_4_ = auVar67._4_4_ * fVar15;
        auVar91._8_4_ = auVar67._8_4_ * fVar16;
        auVar91._12_4_ = auVar67._12_4_ * fVar17;
        auVar98._0_4_ = auVar73._0_4_ * fVar107;
        auVar98._4_4_ = auVar73._4_4_ * fVar110;
        auVar98._8_4_ = auVar73._8_4_ * fVar111;
        auVar98._12_4_ = auVar73._12_4_ * fVar112;
        auVar73 = vfmsub213ps_fma(auVar73,auVar75,auVar91);
        auVar56 = vandps_avx(auVar62,auVar53);
        auVar66 = vandps_avx(auVar91,auVar53);
        auVar56 = vcmpps_avx(auVar56,auVar66,1);
        local_898 = vblendvps_avx(auVar73,auVar72,auVar56);
        auVar92._0_4_ = fVar113 * auVar45._0_4_;
        auVar92._4_4_ = fVar115 * auVar45._4_4_;
        auVar92._8_4_ = fVar116 * auVar45._8_4_;
        auVar92._12_4_ = fVar117 * auVar45._12_4_;
        auVar73 = vfmsub213ps_fma(auVar45,auVar50,auVar98);
        auVar63._0_4_ = auVar71._0_4_ * fVar14;
        auVar63._4_4_ = auVar71._4_4_ * fVar15;
        auVar63._8_4_ = auVar71._8_4_ * fVar16;
        auVar63._12_4_ = auVar71._12_4_ * fVar17;
        auVar72 = vfmsub213ps_fma(auVar99,auVar44,auVar63);
        auVar56 = vandps_avx(auVar63,auVar53);
        auVar66 = vandps_avx(auVar98,auVar53);
        auVar56 = vcmpps_avx(auVar56,auVar66,1);
        local_888 = vblendvps_avx(auVar73,auVar72,auVar56);
        auVar73 = vfmsub213ps_fma(auVar71,auVar75,auVar84);
        auVar67 = vfmsub213ps_fma(auVar67,auVar44,auVar92);
        auVar56 = vandps_avx(auVar84,auVar53);
        auVar66 = vandps_avx(auVar92,auVar53);
        auVar56 = vcmpps_avx(auVar56,auVar66,1);
        local_878 = vblendvps_avx(auVar67,auVar73,auVar56);
        auVar71._0_4_ = local_878._0_4_ * fVar7;
        auVar71._4_4_ = local_878._4_4_ * fVar7;
        auVar71._8_4_ = local_878._8_4_ * fVar7;
        auVar71._12_4_ = local_878._12_4_ * fVar7;
        auVar56 = vfmadd213ps_fma(auVar119,local_888,auVar71);
        auVar56 = vfmadd213ps_fma(auVar101,local_898,auVar56);
        auVar85._0_4_ = auVar56._0_4_ + auVar56._0_4_;
        auVar85._4_4_ = auVar56._4_4_ + auVar56._4_4_;
        auVar85._8_4_ = auVar56._8_4_ + auVar56._8_4_;
        auVar85._12_4_ = auVar56._12_4_ + auVar56._12_4_;
        auVar72._0_4_ = local_878._0_4_ * fVar21;
        auVar72._4_4_ = local_878._4_4_ * fVar11;
        auVar72._8_4_ = local_878._8_4_ * fVar12;
        auVar72._12_4_ = local_878._12_4_ * fVar13;
        auVar56 = vfmadd213ps_fma(auVar57,local_888,auVar72);
        auVar42 = vfmadd213ps_fma(auVar42,local_898,auVar56);
        auVar56 = vrcpps_avx(auVar85);
        auVar102._8_4_ = 0x3f800000;
        auVar102._0_8_ = 0x3f8000003f800000;
        auVar102._12_4_ = 0x3f800000;
        auVar57 = vfnmadd213ps_fma(auVar56,auVar85,auVar102);
        auVar56 = vfmadd132ps_fma(auVar57,auVar56,auVar56);
        local_8a8._0_4_ = (auVar42._0_4_ + auVar42._0_4_) * auVar56._0_4_;
        local_8a8._4_4_ = (auVar42._4_4_ + auVar42._4_4_) * auVar56._4_4_;
        local_8a8._8_4_ = (auVar42._8_4_ + auVar42._8_4_) * auVar56._8_4_;
        local_8a8._12_4_ = (auVar42._12_4_ + auVar42._12_4_) * auVar56._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar93._4_4_ = uVar2;
        auVar93._0_4_ = uVar2;
        auVar93._8_4_ = uVar2;
        auVar93._12_4_ = uVar2;
        auVar56 = vcmpps_avx(auVar93,local_8a8,2);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar103._4_4_ = uVar2;
        auVar103._0_4_ = uVar2;
        auVar103._8_4_ = uVar2;
        auVar103._12_4_ = uVar2;
        auVar104 = ZEXT1664(auVar103);
        auVar42 = vcmpps_avx(local_8a8,auVar103,2);
        auVar56 = vandps_avx(auVar56,auVar42);
        auVar42 = auVar49 & auVar56;
        if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar42[0xf] < '\0') {
          auVar49 = vandps_avx(auVar56,auVar49);
          auVar56 = vcmpps_avx(auVar85,_DAT_01f45a50,4);
          local_8d8 = vandps_avx(auVar49,auVar56);
          uVar24 = vmovmskps_avx(local_8d8);
          if (uVar24 != 0) {
            local_8e8 = &mapUV;
            auVar49 = vrcpps_avx(local_8f8);
            auVar64._8_4_ = 0x3f800000;
            auVar64._0_8_ = 0x3f8000003f800000;
            auVar64._12_4_ = 0x3f800000;
            auVar56 = vfnmadd213ps_fma(local_8f8,auVar49,auVar64);
            auVar49 = vfmadd132ps_fma(auVar56,auVar49,auVar49);
            auVar54._8_4_ = 0x219392ef;
            auVar54._0_8_ = 0x219392ef219392ef;
            auVar54._12_4_ = 0x219392ef;
            auVar43 = vcmpps_avx(auVar43,auVar54,5);
            auVar43 = vandps_avx(auVar49,auVar43);
            auVar47._0_4_ = local_918 * auVar43._0_4_;
            auVar47._4_4_ = fStack_914 * auVar43._4_4_;
            auVar47._8_4_ = fStack_910 * auVar43._8_4_;
            auVar47._12_4_ = fStack_90c * auVar43._12_4_;
            local_8c8 = vminps_avx(auVar47,auVar64);
            auVar48._0_4_ = auVar43._0_4_ * local_908._0_4_;
            auVar48._4_4_ = auVar43._4_4_ * local_908._4_4_;
            auVar48._8_4_ = auVar43._8_4_ * local_908._8_4_;
            auVar48._12_4_ = auVar43._12_4_ * local_908._12_4_;
            local_8b8 = vminps_avx(auVar48,auVar64);
            uVar34 = (ulong)(uVar24 & 0xff);
            do {
              uVar25 = 0;
              for (uVar27 = uVar34; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                uVar25 = uVar25 + 1;
              }
              uVar24 = *(uint *)((long)&local_928 + uVar25 * 4);
              pGVar9 = (scene->geometries).items[uVar24].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar27 = (ulong)(uint)((int)uVar25 * 4);
                  local_838 = *(undefined4 *)(local_8c8 + uVar27);
                  uVar2 = *(undefined4 *)(local_8b8 + uVar27);
                  local_828._4_4_ = uVar2;
                  local_828._0_4_ = uVar2;
                  local_828._8_4_ = uVar2;
                  local_828._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar27);
                  args.context = context->user;
                  local_808._4_4_ = uVar24;
                  local_808._0_4_ = uVar24;
                  local_808._8_4_ = uVar24;
                  local_808._12_4_ = uVar24;
                  uVar2 = *(undefined4 *)((long)&local_938 + uVar27);
                  local_818._4_4_ = uVar2;
                  local_818._0_4_ = uVar2;
                  local_818._8_4_ = uVar2;
                  local_818._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_898 + uVar27);
                  uVar8 = *(undefined4 *)(local_888 + uVar27);
                  local_858._4_4_ = uVar8;
                  local_858._0_4_ = uVar8;
                  local_858._8_4_ = uVar8;
                  local_858._12_4_ = uVar8;
                  uVar8 = *(undefined4 *)(local_878 + uVar27);
                  local_848._4_4_ = uVar8;
                  local_848._0_4_ = uVar8;
                  local_848._8_4_ = uVar8;
                  local_848._12_4_ = uVar8;
                  local_868[0] = (RTCHitN)(char)uVar2;
                  local_868[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar2;
                  local_868[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar2;
                  local_868[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar2;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = uStack_7e8;
                  uStack_7e0 = uStack_7e8;
                  uStack_7dc = uStack_7e8;
                  local_a78 = *local_a60;
                  args.valid = (int *)local_a78;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  auVar43 = auVar104._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&args);
                    auVar104 = ZEXT1664(auVar43);
                  }
                  if (local_a78 == (undefined1  [16])0x0) {
                    auVar43 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar43 = auVar43 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&args);
                      auVar104 = ZEXT1664(auVar43);
                    }
                    auVar49 = vpcmpeqd_avx(local_a78,_DAT_01f45a50);
                    auVar43 = auVar49 ^ _DAT_01f46b70;
                    auVar65._8_4_ = 0xff800000;
                    auVar65._0_8_ = 0xff800000ff800000;
                    auVar65._12_4_ = 0xff800000;
                    auVar49 = vblendvps_avx(auVar65,*(undefined1 (*) [16])(args.ray + 0x80),auVar49)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar49;
                  }
                  auVar55._8_8_ = 0x100000001;
                  auVar55._0_8_ = 0x100000001;
                  if ((auVar55 & auVar43) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar104._0_4_;
                    goto LAB_0157c1eb;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_0157c2e5;
              }
LAB_0157c1eb:
              uVar34 = uVar34 ^ 1L << (uVar25 & 0x3f);
            } while (uVar34 != 0);
          }
        }
      }
      uVar34 = local_a58;
    }
LAB_0157c2ba:
    local_b40 = local_b48;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }